

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar_dates.c
# Opt level: O1

void read_calendar_date(calendar_date_t *record,int field_count,char **field_names,
                       char **field_values)

{
  int iVar1;
  exception_type_t eVar2;
  char *pcVar3;
  calendar_date_t *__dest;
  ulong uVar4;
  
  record->service_id[0] = '\0';
  record->date[0] = '\0';
  record->exception_type = ET_NOT_SET;
  if (0 < field_count) {
    uVar4 = 0;
    do {
      pcVar3 = field_names[uVar4];
      iVar1 = strcmp(pcVar3,"service_id");
      if (iVar1 == 0) {
        pcVar3 = field_values[uVar4];
        __dest = record;
LAB_00104732:
        strcpy(__dest->service_id,pcVar3);
      }
      else {
        iVar1 = strcmp(pcVar3,"date");
        if (iVar1 == 0) {
          pcVar3 = field_values[uVar4];
          __dest = (calendar_date_t *)record->date;
          goto LAB_00104732;
        }
        iVar1 = strcmp(pcVar3,"exception_type");
        if (iVar1 == 0) {
          eVar2 = parse_exception_type(field_values[uVar4]);
          record->exception_type = eVar2;
        }
      }
      uVar4 = uVar4 + 1;
    } while ((uint)field_count != uVar4);
  }
  return;
}

Assistant:

void read_calendar_date(calendar_date_t *record, int field_count, const char **field_names, const char **field_values) {
    init_calendar_date(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "service_id") == 0) {
            strcpy(record->service_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "date") == 0) {
            strcpy(record->date, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "exception_type") == 0) {
            record->exception_type = parse_exception_type(field_values[i]);
            continue;
        }
    }
}